

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O1

void __thiscall
duckdb::BitpackingState<unsigned_short,_short>::CalculateDeltaStats
          (BitpackingState<unsigned_short,_short> *this)

{
  ulong uVar1;
  unsigned_short *puVar2;
  bool bVar3;
  short sVar4;
  short sVar5;
  ulong uVar6;
  long lVar7;
  
  if (((-1 < (short)this->maximum) && (uVar1 = this->compression_buffer_idx, 1 < uVar1)) &&
     (this->all_valid == true)) {
    if (0 < (long)uVar1) {
      puVar2 = this->compression_buffer;
      uVar6 = 0;
      do {
        this->delta_buffer[uVar6] = puVar2[uVar6] - puVar2[uVar6 - 1];
        uVar6 = uVar6 + 1;
      } while (uVar1 != uVar6);
    }
    this->can_do_delta = true;
    sVar4 = this->minimum_delta;
    sVar5 = this->maximum_delta;
    uVar6 = 2;
    if (2 < uVar1) {
      uVar6 = uVar1;
    }
    lVar7 = 0;
    do {
      if (sVar5 <= this->delta_buffer[lVar7 + 1]) {
        sVar5 = this->delta_buffer[lVar7 + 1];
      }
      this->maximum_delta = sVar5;
      if (this->delta_buffer[lVar7 + 1] <= sVar4) {
        sVar4 = this->delta_buffer[lVar7 + 1];
      }
      this->minimum_delta = sVar4;
      lVar7 = lVar7 + 1;
    } while (uVar6 - 1 != lVar7);
    this->delta_buffer[0] = this->minimum_delta;
    bVar3 = TrySubtractOperator::Operation<short,short,short>
                      (this->maximum_delta,this->minimum_delta,&this->min_max_delta_diff);
    this->can_do_delta = bVar3;
    if (bVar3) {
      bVar3 = TrySubtractOperator::Operation<short,short,short>
                        (*this->compression_buffer,this->minimum_delta,&this->delta_offset);
    }
    else {
      bVar3 = false;
    }
    this->can_do_delta = bVar3;
  }
  return;
}

Assistant:

void CalculateDeltaStats() {
		// TODO: currently we dont support delta compression of values above NumericLimits<T_S>::Maximum(),
		// 		 we could support this with some clever substract trickery?
		if (maximum > static_cast<T>(NumericLimits<T_S>::Maximum())) {
			return;
		}

		// Don't delta encoding 1 value makes no sense
		if (compression_buffer_idx < 2) {
			return;
		}

		// TODO: handle NULLS here?
		// Currently we cannot handle nulls because we would need an additional step of patching for this.
		// we could for example copy the last value on a null insert. This would help a bit, but not be optimal for
		// large deltas since theres suddenly a zero then. Ideally we would insert a value that leads to a delta within
		// the current domain of deltas however we dont know that domain here yet
		if (!all_valid) {
			return;
		}

		// Note: since we dont allow any values over NumericLimits<T_S>::Maximum(), all subtractions for unsigned types
		// are guaranteed not to overflow
		bool can_do_all = true;
		if (NumericLimits<T>::IsSigned()) {
			T_S bogus;
			can_do_all = TrySubtractOperator::Operation(static_cast<T_S>(minimum), static_cast<T_S>(maximum), bogus) &&
			             TrySubtractOperator::Operation(static_cast<T_S>(maximum), static_cast<T_S>(minimum), bogus);
		}

		// Calculate delta's
		// compression_buffer pointer points one element ahead of the internal buffer making the use of signed index
		// integer (-1) possible
		D_ASSERT(compression_buffer_idx <= NumericLimits<int64_t>::Maximum());
		if (can_do_all) {
			for (int64_t i = 0; i < static_cast<int64_t>(compression_buffer_idx); i++) {
				delta_buffer[i] = static_cast<T_S>(compression_buffer[i]) - static_cast<T_S>(compression_buffer[i - 1]);
			}
		} else {
			for (int64_t i = 0; i < static_cast<int64_t>(compression_buffer_idx); i++) {
				auto success =
				    TrySubtractOperator::Operation(static_cast<T_S>(compression_buffer[i]),
				                                   static_cast<T_S>(compression_buffer[i - 1]), delta_buffer[i]);
				if (!success) {
					return;
				}
			}
		}

		can_do_delta = true;

		for (idx_t i = 1; i < compression_buffer_idx; i++) {
			maximum_delta = MaxValue<T_S>(maximum_delta, delta_buffer[i]);
			minimum_delta = MinValue<T_S>(minimum_delta, delta_buffer[i]);
		}

		// Since we can set the first value arbitrarily, we want to pick one from the current domain, note that
		// we will store the original first value - this offset as the  delta_offset to be able to decode this again.
		delta_buffer[0] = minimum_delta;

		can_do_delta = can_do_delta && TrySubtractOperator::Operation(maximum_delta, minimum_delta, min_max_delta_diff);
		can_do_delta = can_do_delta && TrySubtractOperator::Operation(static_cast<T_S>(compression_buffer[0]),
		                                                              minimum_delta, delta_offset);
	}